

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CThumbInstruction.cpp
# Opt level: O0

void __thiscall CThumbInstruction::Encode(CThumbInstruction *this)

{
  ushort local_24;
  ushort local_14;
  uint encoding;
  CThumbInstruction *this_local;
  
  if (((this->Vars).UseNewEncoding & 1U) == 0) {
    local_24 = (this->Opcode).encoding;
  }
  else {
    local_24 = (ushort)(this->Vars).NewEncoding;
  }
  local_14 = local_24;
  if (((this->Opcode).field_0x12 & 0x1f) == 0x12) {
    if (((this->Opcode).flags & 0x1000U) == 0) {
      if (((this->Opcode).flags & 2U) != 0) {
        local_14 = (ushort)(this->Vars).Immediate & 0x7ff | local_24;
      }
      WriteInstruction(this,local_14);
    }
    else {
      WriteInstruction(this,(ushort)((this->Vars).Immediate >> 0xb) & 0x7ff | local_24);
      if (((this->Opcode).flags & 0x400U) == 0) {
        WriteInstruction(this,(ushort)(this->Vars).Immediate & 0x7ff | 0xf800);
      }
      else {
        WriteInstruction(this,(ushort)(this->Vars).Immediate & 0x7ff | 0xe800);
      }
    }
  }
  else {
    switch((this->Opcode).field_0x12 & 0x1f) {
    case 0:
      if ((((this->Opcode).flags & 0x20000U) != 0) && ((this->Vars).Immediate == 0)) {
        local_14 = 0;
      }
      local_14 = (ushort)(this->Vars).rd.num |
                 (ushort)((this->Vars).rs.num << 3) |
                 (ushort)(((this->Vars).Immediate & 0x1fU) << 6) | local_14;
      break;
    case 1:
      if (((this->Opcode).flags & 2U) == 0) {
        if (((this->Opcode).flags & 4U) != 0) {
          local_14 = (ushort)((this->Vars).rn.num << 6) | local_24;
        }
      }
      else {
        local_14 = (ushort)((this->Vars).Immediate << 6) | local_24;
      }
      local_14 = (ushort)(this->Vars).rd.num | (ushort)((this->Vars).rs.num << 3) | local_14;
      break;
    case 2:
      local_14 = (ushort)(this->Vars).Immediate | (ushort)((this->Vars).rd.num << 8) | local_24;
      break;
    case 3:
      local_14 = (ushort)(this->Vars).rd.num | (ushort)((this->Vars).rs.num << 3) | local_24;
      break;
    case 4:
      if (((this->Opcode).flags & 8U) != 0) {
        if (7 < (this->Vars).rd.num) {
          local_14 = local_24 | 0x80;
        }
        local_14 = (ushort)(this->Vars).rd.num & 7 | local_14;
      }
      if (((this->Opcode).flags & 0x10U) != 0) {
        if (7 < (this->Vars).rs.num) {
          local_14 = local_14 | 0x40;
        }
        local_14 = (ushort)(((this->Vars).rs.num & 7U) << 3) | local_14;
      }
      break;
    case 5:
      local_14 = (ushort)(this->Vars).Immediate | (ushort)((this->Vars).rd.num << 8) | local_24;
      break;
    case 6:
    case 7:
      local_14 = (ushort)(this->Vars).rd.num |
                 (ushort)((this->Vars).rs.num << 3) | (ushort)((this->Vars).ro.num << 6) | local_24;
      break;
    case 8:
    case 9:
      if (((this->Opcode).flags & 2U) != 0) {
        local_14 = (ushort)((this->Vars).Immediate << 6) | local_24;
      }
      local_14 = (ushort)(this->Vars).rd.num | (ushort)((this->Vars).rs.num << 3) | local_14;
      break;
    case 10:
      local_14 = (ushort)((this->Vars).rd.num << 8) | local_24;
      if (((this->Opcode).flags & 2U) != 0) {
        local_14 = (ushort)(this->Vars).Immediate | local_14;
      }
      break;
    case 0xb:
      local_14 = (ushort)(this->Vars).Immediate | (ushort)((this->Vars).rd.num << 8) | local_24;
      break;
    case 0xc:
      local_14 = (ushort)(this->Vars).Immediate | local_24;
      break;
    case 0xd:
      if (((this->Vars).rlist & 0xc000U) != 0) {
        local_14 = local_24 | 0x100;
      }
      local_14 = (ushort)(this->Vars).rlist & 0xff | local_14;
      break;
    case 0xe:
      local_14 = (ushort)(this->Vars).rlist & 0xff | (ushort)((this->Vars).rd.num << 8) | local_24;
      break;
    case 0xf:
    case 0x10:
    case 0x11:
      local_14 = (ushort)(this->Vars).Immediate | local_24;
    }
    WriteInstruction(this,local_14);
  }
  return;
}

Assistant:

void CThumbInstruction::Encode() const
{
	unsigned int encoding = Vars.UseNewEncoding ? Vars.NewEncoding : Opcode.encoding;

	if (Opcode.type == THUMB_TYPE19)	// THUMB.19: long branch with link
	{
		if (Opcode.flags & THUMB_LONG)
		{
			encoding |= ((Vars.Immediate >> 11) & 0x7FF);
			WriteInstruction(encoding);

			if (Opcode.flags & THUMB_EXCHANGE)
			{
				WriteInstruction(0xE800 | (Vars.Immediate & 0x7FF));
			} else {
				WriteInstruction(0xF800 | (Vars.Immediate & 0x7FF));
			}
		} else {
			if (Opcode.flags & THUMB_IMMEDIATE)
				encoding |= Vars.Immediate & 0x7FF;
			WriteInstruction(encoding);
		}
	} else {
		switch (Opcode.type)
		{
		case THUMB_TYPE1:	// THUMB.1: move shifted register
			if ((Opcode.flags & THUMB_RIGHTSHIFT_IMMEDIATE) && (Vars.Immediate == 0))
			{
				encoding = 0x0000;
			}
			encoding |= ((Vars.Immediate & 0x1F) << 6);
			encoding |= (Vars.rs.num << 3);
			encoding |= (Vars.rd.num << 0);
			break;
		case THUMB_TYPE2:	// THUMB.2: add/subtract
			if (Opcode.flags & THUMB_IMMEDIATE)
			{
				encoding |= (Vars.Immediate << 6);
			} else if (Opcode.flags & THUMB_REGISTER)
			{
				encoding |= (Vars.rn.num << 6);
			}
			encoding |= (Vars.rs.num << 3);
			encoding |= (Vars.rd.num << 0);
			break;
		case THUMB_TYPE3:	// THUMB.3: move/compare/add/subtract immediate
			encoding |= (Vars.rd.num << 8);
			encoding |= (Vars.Immediate << 0);
			break;
		case THUMB_TYPE4:	// THUMB.4: ALU operations
			encoding |= (Vars.rs.num << 3);
			encoding |= (Vars.rd.num << 0);
			break;
		case THUMB_TYPE5:	// THUMB.5: Hi register operations/branch exchange
			if (Opcode.flags & THUMB_D)
			{
				if (Vars.rd.num > 0x7) encoding |= (1 << 7);
				encoding |= (Vars.rd.num & 0x7);
			}
			if (Opcode.flags & THUMB_S)
			{
				if (Vars.rs.num > 0x7) encoding |= (1 << 6);
				encoding |= ((Vars.rs.num & 0x7) << 3);
			}
			break;
		case THUMB_TYPE6:	// THUMB.6: load PC-relative
			encoding |= (Vars.rd.num << 8);
			encoding |= (Vars.Immediate << 0);
			break;
		case THUMB_TYPE7:	// THUMB.7: load/store with register offset
		case THUMB_TYPE8:	// THUMB.8: load/store sign-extended byte/halfword
			encoding |= (Vars.ro.num << 6);
			encoding |= (Vars.rs.num << 3);
			encoding |= (Vars.rd.num << 0);
			break;
		case THUMB_TYPE9:	// THUMB.9: load/store with immediate offset
		case THUMB_TYPE10:	// THUMB.10: load/store halfword
			if (Opcode.flags & THUMB_IMMEDIATE) encoding |= (Vars.Immediate << 6);
			encoding |= (Vars.rs.num << 3);
			encoding |= (Vars.rd.num << 0);
			break;
		case THUMB_TYPE11:	// THUMB.11: load/store SP-relative
			encoding |= (Vars.rd.num << 8);
			if (Opcode.flags & THUMB_IMMEDIATE) encoding |= (Vars.Immediate << 0);
			break;
		case THUMB_TYPE12:	// THUMB.12: get relative address
			encoding |= (Vars.rd.num << 8);
			encoding |= (Vars.Immediate << 0);
			break;
		case THUMB_TYPE13:	// THUMB.13: add/subtract offset to/from stack pointer
			encoding |= (Vars.Immediate << 0);
			break;
		case THUMB_TYPE14:	// THUMB.14: push/pop registers
			if (Vars.rlist & 0xC000) encoding |= (1 << 8); // r14 oder r15
			encoding |= (Vars.rlist & 0xFF);
			break;
		case THUMB_TYPE15:	// THUMB.15: multiple load/store
			encoding |= (Vars.rd.num << 8);
			encoding |= (Vars.rlist & 0xFF);
			break;
		case THUMB_TYPE16:	// THUMB.16: conditional branch
		case THUMB_TYPE17:	// THUMB.17: software interrupt and breakpoint
		case THUMB_TYPE18:	// THUMB.18: unconditional branch
			encoding |= (Vars.Immediate << 0);
			break;
		}
		WriteInstruction(encoding);
	}
}